

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_dup_r(lyd_node *node,ly_ctx *trg_ctx,lyd_node *parent,uint32_t insert_order,
                lyd_node **first,uint32_t options,lyd_node **dup_p)

{
  uint16_t uVar1;
  lysc_type *type_00;
  char *__s;
  size_t value_len;
  ly_ht *plVar2;
  bool bVar3;
  ly_ctx *local_d8;
  ly_ctx *local_c8;
  ly_ctx *local_b0;
  lyd_node *local_a8;
  lyd_node *child_1;
  lyd_node_inner *orig_2;
  lyd_node_term *orig_1;
  lyd_node_term *term;
  lyd_node *child;
  lyd_node_opaq *orig;
  lyd_node_opaq *opaq;
  char *val_can;
  lysc_type *type;
  lyd_node_any *any;
  lyd_attr *attr;
  lyd_meta *meta;
  lyd_node *dup;
  LY_ERR ret;
  uint32_t options_local;
  lyd_node **first_local;
  uint32_t insert_order_local;
  lyd_node *parent_local;
  ly_ctx *trg_ctx_local;
  lyd_node *node_local;
  
  meta = (lyd_meta *)0x0;
  if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_dup_r");
    return LY_EINVAL;
  }
  parent_local = (lyd_node *)trg_ctx;
  if ((node->flags & 8) != 0) {
    if ((options & 0x10) != 0) {
      return LY_SUCCESS;
    }
    if (node->schema == (lysc_node *)0x0) {
      local_b0 = (ly_ctx *)node[2].schema;
    }
    else {
      local_b0 = node->schema->module->ctx;
    }
    parent_local = (lyd_node *)local_b0;
  }
  if (node->schema == (lysc_node *)0x0) {
    meta = (lyd_meta *)calloc(1,0x80);
    meta[1].value.field_2.enum_item = (lysc_type_bitenum_item *)parent_local;
  }
  else {
    uVar1 = node->schema->nodetype;
    if (uVar1 != 1) {
      if ((uVar1 == 4) || (uVar1 == 8)) {
        meta = (lyd_meta *)calloc(1,0x60);
        goto LAB_00135433;
      }
      if (uVar1 != 0x10) {
        if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
          meta = (lyd_meta *)calloc(1,0x48);
          goto LAB_00135433;
        }
        if (((uVar1 != 0x100) && (uVar1 != 0x200)) && (uVar1 != 0x400)) {
          ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                 ,0x810);
          dup._0_4_ = LY_EINT;
          goto LAB_00135bf3;
        }
      }
    }
    meta = (lyd_meta *)calloc(1,0x48);
  }
LAB_00135433:
  if (meta == (lyd_meta *)0x0) {
    ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_r");
    dup._0_4_ = LY_EMEM;
  }
  else {
    if ((options & 8) == 0) {
      *(uint32_t *)((long)&meta->parent + 4) = node->flags & 9 | 4;
    }
    else {
      *(uint32_t *)((long)&meta->parent + 4) = node->flags;
    }
    if ((options & 0x20) != 0) {
      (meta->value).field_2.dec64 = (int64_t)node->priv;
    }
    if (node->schema == (lysc_node *)0x0) {
      local_c8 = (ly_ctx *)node[2].schema;
    }
    else {
      local_c8 = node->schema->module->ctx;
    }
    if ((ly_ctx *)parent_local == local_c8) {
      meta->next = (lyd_meta *)node->schema;
    }
    else {
      dup._0_4_ = lyd_find_schema_ctx(node->schema,(ly_ctx *)parent_local,parent,'\x01',
                                      (lysc_node **)&meta->next);
      if ((LY_ERR)dup != LY_SUCCESS) {
        free(meta);
        meta = (lyd_meta *)0x0;
        goto LAB_00135bf3;
      }
    }
    (meta->value)._canonical = (char *)meta;
    if ((options & 2) == 0) {
      if (node->schema == (lysc_node *)0x0) {
        for (any = *(lyd_node_any **)(node + 2); any != (lyd_node_any *)0x0;
            any = (lyd_node_any *)(any->field_0).node.schema) {
          dup._0_4_ = lyd_dup_attr_single((lyd_attr *)any,(lyd_node *)meta,(lyd_attr **)0x0);
          if ((LY_ERR)dup != LY_SUCCESS) goto LAB_00135bf3;
        }
      }
      else {
        for (attr = (lyd_attr *)node->meta; attr != (lyd_attr *)0x0; attr = attr->next) {
          dup._0_4_ = lyd_dup_meta_single_to_ctx
                                ((ly_ctx *)parent_local,(lyd_meta *)attr,(lyd_node *)meta,
                                 (lyd_meta **)0x0);
          if ((LY_ERR)dup != LY_SUCCESS) goto LAB_00135bf3;
        }
      }
    }
    if (meta->next == (lyd_meta *)0x0) {
      if ((options & 1) != 0) {
        for (term = *(lyd_node_term **)(node + 1); term != (lyd_node_term *)0x0;
            term = (lyd_node_term *)(term->field_0).node.next) {
          dup._0_4_ = lyd_dup_r((lyd_node *)term,(ly_ctx *)parent_local,(lyd_node *)meta,1,
                                (lyd_node **)0x0,options,(lyd_node **)0x0);
          if ((LY_ERR)dup != LY_SUCCESS) goto LAB_00135bf3;
        }
      }
      dup._0_4_ = lydict_insert((ly_ctx *)parent_local,(char *)node[1].schema,0,
                                (char **)((long)&(meta->value).field_2 + 0x10));
      if (((((LY_ERR)dup != LY_SUCCESS) ||
           (dup._0_4_ = lydict_insert((ly_ctx *)parent_local,(char *)node[1].parent,0,
                                      (char **)(meta + 1)), (LY_ERR)dup != LY_SUCCESS)) ||
          (dup._0_4_ = lydict_insert((ly_ctx *)parent_local,(char *)node[1].next,0,
                                     (char **)&meta[1].next), (LY_ERR)dup != LY_SUCCESS)) ||
         (dup._0_4_ = lydict_insert((ly_ctx *)parent_local,(char *)node[1].prev,0,
                                    (char **)&meta[1].annotation), (LY_ERR)dup != LY_SUCCESS))
      goto LAB_00135bf3;
      *(undefined4 *)&meta[1].name = *(undefined4 *)&node[1].meta;
      *(undefined4 *)((long)&meta[1].name + 4) = *(undefined4 *)((long)&node[1].meta + 4);
      if (node[1].priv == (void *)0x0) goto LAB_00135bc4;
      dup._0_4_ = ly_dup_prefix_data((ly_ctx *)parent_local,
                                     *(LY_VALUE_FORMAT *)((long)&meta[1].name + 4),node[1].priv,
                                     &meta[1].value._canonical);
    }
    else {
      if (((ulong)meta->next->parent & 0xc) == 0) {
        if (((ulong)meta->next->parent & 0x711) == 0) {
          if (((ulong)meta->next->parent & 0x60) != 0) {
            *(uint32_t *)&meta->parent = node->hash;
            dup._0_4_ = lyd_any_copy_value((lyd_node *)meta,(lyd_any_value *)(node + 1),
                                           *(LYD_ANYDATA_VALUETYPE *)&node[1].schema);
            if ((LY_ERR)dup != LY_SUCCESS) goto LAB_00135bf3;
          }
        }
        else {
          if ((options & 1) == 0) {
            if ((*(short *)&meta->next->parent == 0x10) &&
               (((ulong)meta->next->parent & 0x2000000) == 0)) {
              local_a8 = *(lyd_node **)(node + 1);
              while( true ) {
                bVar3 = false;
                if (local_a8 != (lyd_node *)0x0) {
                  bVar3 = true;
                  if ((local_a8->schema != (lysc_node *)0x0) &&
                     (bVar3 = true, local_a8->schema->nodetype == 4)) {
                    bVar3 = (local_a8->schema->flags & 0x100) == 0;
                  }
                  bVar3 = !bVar3;
                }
                if (!bVar3) goto LAB_00135b68;
                dup._0_4_ = lyd_dup_r(local_a8,(ly_ctx *)parent_local,(lyd_node *)meta,1,
                                      (lyd_node **)0x0,options,(lyd_node **)0x0);
                if ((LY_ERR)dup != LY_SUCCESS) break;
                local_a8 = local_a8->next;
              }
              goto LAB_00135bf3;
            }
          }
          else {
            if (node[1].schema != (lysc_node *)0x0) {
              plVar2 = lyht_new(*(uint32_t *)(node[1].schema)->hash,8,lyd_hash_table_val_equal,
                                (void *)0x0,1);
              *(ly_ht **)((long)&(meta->value).field_2 + 0x10) = plVar2;
            }
            for (local_a8 = *(lyd_node **)(node + 1); local_a8 != (lyd_node *)0x0;
                local_a8 = local_a8->next) {
              dup._0_4_ = lyd_dup_r(local_a8,(ly_ctx *)parent_local,(lyd_node *)meta,1,
                                    (lyd_node **)0x0,options,(lyd_node **)0x0);
              if ((LY_ERR)dup != LY_SUCCESS) goto LAB_00135bf3;
            }
          }
LAB_00135b68:
          lyd_hash((lyd_node *)meta);
        }
        goto LAB_00135bc4;
      }
      *(uint32_t *)&meta->parent = node->hash;
      if (node->schema == (lysc_node *)0x0) {
        local_d8 = (ly_ctx *)node[2].schema;
      }
      else {
        local_d8 = node->schema->module->ctx;
      }
      if ((ly_ctx *)parent_local == local_d8) {
        dup._0_4_ = (*(code *)(node[1].schema)->parent->dsc)
                              (parent_local,node + 1,
                               (undefined1 *)((long)&(meta->value).field_2 + 8));
        if ((LY_ERR)dup != LY_SUCCESS) {
          ly_log((ly_ctx *)parent_local,LY_LLERR,(LY_ERR)dup,"Value duplication failed.");
          goto LAB_00135bf3;
        }
        goto LAB_00135bc4;
      }
      __s = lyd_get_value(node);
      type_00 = (lysc_type *)meta->next[1].name;
      value_len = strlen(__s);
      dup._0_4_ = lyd_value_store((ly_ctx *)parent_local,
                                  (lyd_value *)((long)&(meta->value).field_2 + 8),type_00,__s,
                                  value_len,'\x01','\x01',(ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,
                                  0x3f3,(lysc_node *)meta->next,(ly_bool *)0x0);
    }
    if ((LY_ERR)dup == LY_SUCCESS) {
LAB_00135bc4:
      lyd_insert_node(parent,first,(lyd_node *)meta,insert_order);
      if (dup_p != (lyd_node **)0x0) {
        *dup_p = (lyd_node *)meta;
      }
      return LY_SUCCESS;
    }
  }
LAB_00135bf3:
  lyd_free_tree((lyd_node *)meta);
  return (LY_ERR)dup;
}

Assistant:

static LY_ERR
lyd_dup_r(const struct lyd_node *node, const struct ly_ctx *trg_ctx, struct lyd_node *parent, uint32_t insert_order,
        struct lyd_node **first, uint32_t options, struct lyd_node **dup_p)
{
    LY_ERR ret;
    struct lyd_node *dup = NULL;
    struct lyd_meta *meta;
    struct lyd_attr *attr;
    struct lyd_node_any *any;
    const struct lysc_type *type;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, node, LY_EINVAL);

    if (node->flags & LYD_EXT) {
        if (options & LYD_DUP_NO_EXT) {
            /* no not duplicate this subtree */
            return LY_SUCCESS;
        }

        /* we need to use the same context */
        trg_ctx = LYD_CTX(node);
    }

    if (!node->schema) {
        dup = calloc(1, sizeof(struct lyd_node_opaq));
        ((struct lyd_node_opaq *)dup)->ctx = trg_ctx;
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
        case LYS_LIST:
            dup = calloc(1, sizeof(struct lyd_node_inner));
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            dup = calloc(1, sizeof(struct lyd_node_term));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            dup = calloc(1, sizeof(struct lyd_node_any));
            break;
        default:
            LOGINT(trg_ctx);
            ret = LY_EINT;
            goto error;
        }
    }
    LY_CHECK_ERR_GOTO(!dup, LOGMEM(trg_ctx); ret = LY_EMEM, error);

    if (options & LYD_DUP_WITH_FLAGS) {
        dup->flags = node->flags;
    } else {
        dup->flags = (node->flags & (LYD_DEFAULT | LYD_EXT)) | LYD_NEW;
    }
    if (options & LYD_DUP_WITH_PRIV) {
        dup->priv = node->priv;
    }
    if (trg_ctx == LYD_CTX(node)) {
        dup->schema = node->schema;
    } else {
        ret = lyd_find_schema_ctx(node->schema, trg_ctx, parent, 1, &dup->schema);
        if (ret) {
            /* has no schema but is not an opaque node */
            free(dup);
            dup = NULL;
            goto error;
        }
    }
    dup->prev = dup;

    /* duplicate metadata/attributes */
    if (!(options & LYD_DUP_NO_META)) {
        if (!node->schema) {
            LY_LIST_FOR(((struct lyd_node_opaq *)node)->attr, attr) {
                LY_CHECK_GOTO(ret = lyd_dup_attr_single(attr, dup, NULL), error);
            }
        } else {
            LY_LIST_FOR(node->meta, meta) {
                LY_CHECK_GOTO(ret = lyd_dup_meta_single_to_ctx(trg_ctx, meta, dup, NULL), error);
            }
        }
    }

    /* nodetype-specific work */
    if (!dup->schema) {
        struct lyd_node_opaq *opaq = (struct lyd_node_opaq *)dup;
        struct lyd_node_opaq *orig = (struct lyd_node_opaq *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.name, 0, &opaq->name.name), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.prefix, 0, &opaq->name.prefix), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->name.module_ns, 0, &opaq->name.module_ns), error);
        LY_CHECK_GOTO(ret = lydict_insert(trg_ctx, orig->value, 0, &opaq->value), error);
        opaq->hints = orig->hints;
        opaq->format = orig->format;
        if (orig->val_prefix_data) {
            ret = ly_dup_prefix_data(trg_ctx, opaq->format, orig->val_prefix_data, &opaq->val_prefix_data);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_TERM) {
        struct lyd_node_term *term = (struct lyd_node_term *)dup;
        struct lyd_node_term *orig = (struct lyd_node_term *)node;

        term->hash = orig->hash;
        if (trg_ctx == LYD_CTX(node)) {
            ret = orig->value.realtype->plugin->duplicate(trg_ctx, &orig->value, &term->value);
            LY_CHECK_ERR_GOTO(ret, LOGERR(trg_ctx, ret, "Value duplication failed."), error);
        } else {
            /* store canonical value in the target context */
            val_can = lyd_get_value(node);
            type = ((struct lysc_node_leaf *)term->schema)->type;
            ret = lyd_value_store(trg_ctx, &term->value, type, val_can, strlen(val_can), 1, 1, NULL, LY_VALUE_CANON, NULL,
                    LYD_HINT_DATA, term->schema, NULL);
            LY_CHECK_GOTO(ret, error);
        }
    } else if (dup->schema->nodetype & LYD_NODE_INNER) {
        struct lyd_node_inner *orig = (struct lyd_node_inner *)node;
        struct lyd_node *child;

        if (options & LYD_DUP_RECURSIVE) {
            /* create a hash table with the size of the previous hash table (duplicate) */
            if (orig->children_ht) {
                ((struct lyd_node_inner *)dup)->children_ht = lyht_new(orig->children_ht->size, sizeof(struct lyd_node *), lyd_hash_table_val_equal, NULL, 1);
            }

            /* duplicate all the children */
            LY_LIST_FOR(orig->child, child) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        } else if ((dup->schema->nodetype == LYS_LIST) && !(dup->schema->flags & LYS_KEYLESS)) {
            /* always duplicate keys of a list */
            for (child = orig->child; child && lysc_is_key(child->schema); child = child->next) {
                LY_CHECK_GOTO(ret = lyd_dup_r(child, trg_ctx, dup, LYD_INSERT_NODE_LAST, NULL, options, NULL), error);
            }
        }
        lyd_hash(dup);
    } else if (dup->schema->nodetype & LYD_NODE_ANY) {
        dup->hash = node->hash;
        any = (struct lyd_node_any *)node;
        LY_CHECK_GOTO(ret = lyd_any_copy_value(dup, &any->value, any->value_type), error);
    }

    /* insert */
    lyd_insert_node(parent, first, dup, insert_order);

    if (dup_p) {
        *dup_p = dup;
    }
    return LY_SUCCESS;

error:
    lyd_free_tree(dup);
    return ret;
}